

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  base_iterator bVar2;
  directory_iterator dVar3;
  iterator __begin1;
  embedded_filesystem fs;
  directory_entry local_58;
  
  fs = cmrc::iterate::get_filesystem();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"",(allocator<char> *)&__begin1);
  dVar3 = cmrc::embedded_filesystem::iterate_directory(&fs,&local_58._fname);
  bVar2 = dVar3._base_iter._M_node;
  std::__cxx11::string::~string((string *)&local_58);
  __begin1 = dVar3;
  while (bVar2._M_node != dVar3._end_iter._M_node._M_node) {
    cmrc::detail::directory::iterator::operator*(&local_58,&__begin1);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_58);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_58);
    bVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(__begin1._base_iter._M_node);
    __begin1._base_iter._M_node = bVar2._M_node;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"subdir_a/subdir_b",(allocator<char> *)&__begin1);
  dVar3 = cmrc::embedded_filesystem::iterate_directory(&fs,&local_58._fname);
  bVar2 = dVar3._base_iter._M_node;
  std::__cxx11::string::~string((string *)&local_58);
  __begin1 = dVar3;
  while (bVar2._M_node != dVar3._end_iter._M_node._M_node) {
    cmrc::detail::directory::iterator::operator*(&local_58,&__begin1);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_58);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_58);
    bVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(__begin1._base_iter._M_node);
    __begin1._base_iter._M_node = bVar2._M_node;
  }
  return 0;
}

Assistant:

int main() {
    auto fs = cmrc::iterate::get_filesystem();
    for (auto&& entry : fs.iterate_directory("")) {
        std::cout << entry.filename() << '\n';
    }
    for (auto&& entry : fs.iterate_directory("subdir_a/subdir_b")) {
        std::cout << entry.filename() << '\n';
    }
}